

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcexecutors.cpp
# Opt level: O0

TestFuncExecutorBase * trun::TestFuncExecutorFactory::Create(Ref *library)

{
  int iVar1;
  Config *pCVar2;
  shared_ptr<trun::IDynLibrary> local_48 [2];
  shared_ptr<trun::IDynLibrary> local_28;
  Ref *local_18;
  Ref *library_local;
  
  local_18 = library;
  if (Create(std::shared_ptr<trun::IDynLibrary>)::sequentialExecutor == '\0') {
    iVar1 = __cxa_guard_acquire(&Create(std::shared_ptr<trun::IDynLibrary>)::sequentialExecutor);
    if (iVar1 != 0) {
      __cxa_atexit(TestFuncExecutorSequential::~TestFuncExecutorSequential,
                   &Create::sequentialExecutor,&__dso_handle);
      __cxa_guard_release(&Create(std::shared_ptr<trun::IDynLibrary>)::sequentialExecutor);
    }
  }
  pCVar2 = Config::Instance();
  if (pCVar2->testExecutionType == kSequential) {
    std::shared_ptr<trun::IDynLibrary>::shared_ptr(&local_28,library);
    TestFuncExecutorBase::SetLibrary
              (&Create::sequentialExecutor.super_TestFuncExecutorBase,&local_28);
    std::shared_ptr<trun::IDynLibrary>::~shared_ptr(&local_28);
  }
  else {
    printf("Unknown or unsupported test execution model, using default\n");
    std::shared_ptr<trun::IDynLibrary>::shared_ptr(local_48,library);
    TestFuncExecutorBase::SetLibrary
              (&Create::sequentialExecutor.super_TestFuncExecutorBase,local_48);
    std::shared_ptr<trun::IDynLibrary>::~shared_ptr(local_48);
  }
  return &Create::sequentialExecutor.super_TestFuncExecutorBase;
}

Assistant:

TestFuncExecutorBase &TestFuncExecutorFactory::Create(IDynLibrary::Ref library) {
    static TestFuncExecutorSequential sequentialExecutor;
#ifdef TRUN_HAVE_THREADS
    static TestFuncExecutorParallel parallelExecutor;
    static TestFuncExecutorParallelPThread parallelExecutorPThread;
#endif

    switch(Config::Instance().testExecutionType) {
        case TestExecutiontype::kSequential :
            // In case we are a sub-process, we run in threads anyway  <- should we?
#ifdef TRUN_HAVE_THREADS
            if (Config::Instance().isSubProcess) {
                parallelExecutor.SetLibrary(library);
                return parallelExecutor;
            }
#endif
            sequentialExecutor.SetLibrary(library);
            return sequentialExecutor;
#ifdef TRUN_HAVE_THREADS
        case TestExecutiontype::kThreaded :
            parallelExecutor.SetLibrary(library);
            return parallelExecutor;
        case TestExecutiontype::kThreadedWithExit :
            parallelExecutorPThread.SetLibrary(library);
            return parallelExecutorPThread;
#endif
        default:
            printf("Unknown or unsupported test execution model, using default\n");
            break;
    }
    // Always available
    sequentialExecutor.SetLibrary(library);
    return sequentialExecutor;
}